

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalCommonGenerator.cxx
# Opt level: O0

void __thiscall cmLocalCommonGenerator::~cmLocalCommonGenerator(cmLocalCommonGenerator *this)

{
  cmLocalCommonGenerator *this_local;
  
  (this->super_cmLocalGenerator)._vptr_cmLocalGenerator =
       (_func_int **)&PTR__cmLocalCommonGenerator_009690c0;
  std::__cxx11::string::~string((string *)&this->ConfigName);
  std::__cxx11::string::~string((string *)&this->WorkingDirectory);
  cmLocalGenerator::~cmLocalGenerator(&this->super_cmLocalGenerator);
  return;
}

Assistant:

cmLocalCommonGenerator::~cmLocalCommonGenerator() = default;